

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEngine::initialize
          (QNativeSocketEngine *this,SocketType socketType,NetworkLayerProtocol protocol)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  NetworkLayerProtocol protocol_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  protocol_local = protocol;
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 != '\0') {
    (**(code **)(*(long *)this + 0xa8))(this);
  }
  bVar2 = QNativeSocketEnginePrivate::createNewSocket(this_00,socketType,&protocol_local);
  if (bVar2) {
    bVar2 = true;
    if (socketType == TcpSocket) {
      cVar1 = (**(code **)(*(long *)this + 0x118))(this,6,1);
      if (cVar1 == '\0') {
        local_50[0] = '\x02';
        local_50[1] = '\0';
        local_50[2] = '\0';
        local_50[3] = '\0';
        local_50[0x14] = '\0';
        local_50[0x15] = '\0';
        local_50[0x16] = '\0';
        local_50[0x17] = '\0';
        local_50[4] = '\0';
        local_50[5] = '\0';
        local_50[6] = '\0';
        local_50[7] = '\0';
        local_50[8] = '\0';
        local_50[9] = '\0';
        local_50[10] = '\0';
        local_50[0xb] = '\0';
        local_50[0xc] = '\0';
        local_50[0xd] = '\0';
        local_50[0xe] = '\0';
        local_50[0xf] = '\0';
        local_50[0x10] = '\0';
        local_50[0x11] = '\0';
        local_50[0x12] = '\0';
        local_50[0x13] = '\0';
        local_38 = "default";
        QMessageLogger::warning
                  (local_50,"QNativeSocketEngine::initialize unable to inline out-of-band data");
      }
      goto LAB_001b82d0;
    }
    if (socketType != UdpSocket) goto LAB_001b82d0;
    cVar1 = (**(code **)(*(long *)this + 0x118))(this,1);
    if (cVar1 != '\0') {
      (**(code **)(*(long *)this + 0x118))(this,0xc,1);
      (**(code **)(*(long *)this + 0x118))(this,0xd,1);
      goto LAB_001b82d0;
    }
    QNativeSocketEnginePrivate::setError
              (this_00,UnsupportedSocketOperationError,BroadcastingInitFailedErrorString);
    (**(code **)(*(long *)this + 0xa8))(this);
  }
  bVar2 = false;
LAB_001b82d0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEngine::initialize(QAbstractSocket::SocketType socketType, QAbstractSocket::NetworkLayerProtocol protocol)
{
    Q_D(QNativeSocketEngine);
    if (isValid())
        close();

    // Create the socket
    if (!d->createNewSocket(socketType, protocol)) {
#if defined (QNATIVESOCKETENGINE_DEBUG)
        QString typeStr = "UnknownSocketType"_L1;
        if (socketType == QAbstractSocket::TcpSocket) typeStr = "TcpSocket"_L1;
        else if (socketType == QAbstractSocket::UdpSocket) typeStr = "UdpSocket"_L1;
        else if (socketType == QAbstractSocket::SctpSocket) typeStr = "SctpSocket"_L1;
        QString protocolStr = "UnknownProtocol"_L1;
        if (protocol == QAbstractSocket::IPv4Protocol) protocolStr = "IPv4Protocol"_L1;
        else if (protocol == QAbstractSocket::IPv6Protocol) protocolStr = "IPv6Protocol"_L1;
        qDebug("QNativeSocketEngine::initialize(type == %s, protocol == %s) failed: %s",
               typeStr.toLatin1().constData(), protocolStr.toLatin1().constData(), d->socketErrorString.toLatin1().constData());
#endif
        return false;
    }

    if (socketType == QAbstractSocket::UdpSocket) {
        // Set the broadcasting flag if it's a UDP socket.
        if (!setOption(BroadcastSocketOption, 1)) {
            d->setError(QAbstractSocket::UnsupportedSocketOperationError,
                        QNativeSocketEnginePrivate::BroadcastingInitFailedErrorString);
            close();
            return false;
        }

        // Set some extra flags that are interesting to us, but accept failure
        setOption(ReceivePacketInformation, 1);
        setOption(ReceiveHopLimit, 1);
    }


#ifndef Q_OS_WASM
    // Make sure we receive out-of-band data
    if (socketType == QAbstractSocket::TcpSocket
        && !setOption(ReceiveOutOfBandData, 1)) {
        qWarning("QNativeSocketEngine::initialize unable to inline out-of-band data");
    }
#endif

    // Before Qt 4.6, we always set the send and receive buffer size to 49152 as
    // this was found to be an optimal value. However, modern OS
    // all have some kind of auto tuning for this and we therefore don't set
    // this explicitly anymore.
    // If it introduces any performance regressions for Qt 4.6.x (x > 0) then
    // it will be put back in.
    //
    // You can use tests/manual/qhttpnetworkconnection to test HTTP download speed
    // with this.
    //
    // pre-4.6:
    // setReceiveBufferSize(49152);
    // setSendBufferSize(49152);

    return true;
}